

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountFailureRepr.cpp
# Opt level: O0

void __thiscall
CountFailureRepr::CountFailureRepr
          (CountFailureRepr *this,shared_ptr<const_oout::CountFailure> *count)

{
  shared_ptr<const_oout::CountFailure> *count_local;
  CountFailureRepr *this_local;
  
  oout::Text::Text(&this->super_Text);
  (this->super_Text)._vptr_Text = (_func_int **)&PTR__CountFailureRepr_00323af0;
  std::shared_ptr<const_oout::CountFailure>::shared_ptr(&this->count,count);
  return;
}

Assistant:

CountFailureRepr::CountFailureRepr(const shared_ptr<const CountFailure> &count)
	: count(count)
{
}